

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_serial_dump.cpp
# Opt level: O0

vector<serial_port,_std::allocator<serial_port>_> *
open_ports(vector<serial_port,_std::allocator<serial_port>_> *__return_storage_ptr__,
          vector<interface,_std::allocator<interface>_> *interfaces,io_context *queue)

{
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<serial_port,_std::allocator<serial_port>_>_> __result;
  io_context *queue_local;
  vector<interface,_std::allocator<interface>_> *interfaces_local;
  vector<serial_port,_std::allocator<serial_port>_> *ports;
  
  std::vector<serial_port,_std::allocator<serial_port>_>::vector(__return_storage_ptr__);
  __first = std::vector<interface,_std::allocator<interface>_>::begin(interfaces);
  __last = std::vector<interface,_std::allocator<interface>_>::end(interfaces);
  __result = std::back_inserter<std::vector<serial_port,std::allocator<serial_port>>>
                       (__return_storage_ptr__);
  std::
  transform<__gnu_cxx::__normal_iterator<interface_const*,std::vector<interface,std::allocator<interface>>>,std::back_insert_iterator<std::vector<serial_port,std::allocator<serial_port>>>,open_ports(std::vector<interface,std::allocator<interface>>const&,boost::asio::io_context&)::__0>
            ((__normal_iterator<const_interface_*,_std::vector<interface,_std::allocator<interface>_>_>
              )__first._M_current,
             (__normal_iterator<const_interface_*,_std::vector<interface,_std::allocator<interface>_>_>
              )__last._M_current,__result,(anon_class_8_1_a8890831)queue);
  return __return_storage_ptr__;
}

Assistant:

std::vector< serial_port > open_ports(
    const std::vector< interface >& interfaces, boost::asio::io_context& queue )
{
    std::vector< serial_port > ports;

    std::transform( interfaces.begin(), interfaces.end(), back_inserter( ports ),
        [&queue]( const interface& config )
        {
            serial_port port( config, queue );

            boost::system::error_code ec;
            port.port.open( config.device(), ec );

            if ( ec )
                throw std::runtime_error( "error opening interface \"" + config.device() + "\": " + ec.message() );

            set_port_option( port, config.baud_rate(), config.device(), "baud_rate" );
            set_port_option( port, config.parity(), config.device(), "parity" );
            set_port_option( port, config.stop_bits(), config.device(), "stop_bits" );
            set_port_option( port, config.character_size(), config.device(), "character_size" );

            return port;
        }
    );

    return ports;
}